

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O3

void __thiscall CTcGramProdEntry::move_alts_to(CTcGramProdEntry *this,CTcGramProdEntry *new_entry)

{
  CTcGramProdAlt *pCVar1;
  CTcGramProdAlt *pCVar2;
  CTcGramProdAlt **ppCVar3;
  
  if (this->alt_head_ != (CTcGramProdAlt *)0x0) {
    pCVar2 = this->alt_head_;
    do {
      pCVar1 = pCVar2->nxt_;
      pCVar2->nxt_ = (CTcGramProdAlt *)0x0;
      ppCVar3 = &new_entry->alt_tail_->nxt_;
      if (new_entry->alt_tail_ == (CTcGramProdAlt *)0x0) {
        ppCVar3 = &new_entry->alt_head_;
      }
      *ppCVar3 = pCVar2;
      new_entry->alt_tail_ = pCVar2;
      pCVar2->nxt_ = (CTcGramProdAlt *)0x0;
      pCVar2 = pCVar1;
    } while (pCVar1 != (CTcGramProdAlt *)0x0);
  }
  this->alt_head_ = (CTcGramProdAlt *)0x0;
  this->alt_tail_ = (CTcGramProdAlt *)0x0;
  return;
}

Assistant:

void CTcGramProdEntry::move_alts_to(CTcGramProdEntry *new_entry)
{
    CTcGramProdAlt *alt;
    CTcGramProdAlt *nxt;

    /* move each of my alternatives */
    for (alt = alt_head_ ; alt != 0 ; alt = nxt)
    {
        /* remember the next alternative, since we're unlinking this one */
        nxt = alt->get_next();

        /* unlink this one from the list */
        alt->set_next(0);

        /* link this one into the new owner's list */
        new_entry->add_alt(alt);
    }

    /* there's nothing left in our list */
    alt_head_ = alt_tail_ = 0;
}